

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_result drwav_uninit(drwav *pWav)

{
  int iVar1;
  long *in_RDI;
  drwav_uint64 dataChunkSize_2;
  drwav_uint64 riffChunkSize_2;
  int ds64BodyPos;
  drwav_uint64 dataChunkSize_1;
  drwav_uint64 riffChunkSize_1;
  drwav_uint32 dataChunkSize;
  drwav_uint32 riffChunkSize;
  drwav_uint64 paddingData;
  drwav_uint32 paddingSize;
  drwav_result result;
  drwav *in_stack_ffffffffffffffa8;
  drwav *in_stack_ffffffffffffffb0;
  uint local_18;
  drwav_result local_14;
  drwav_result local_4;
  
  local_14 = 0;
  if (in_RDI == (long *)0x0) {
    local_4 = -2;
  }
  else {
    if (in_RDI[1] != 0) {
      if (((int)in_RDI[8] == 0) || ((int)in_RDI[8] == 2)) {
        local_18 = drwav__chunk_padding_size_riff(in_RDI[0x10]);
      }
      else {
        local_18 = drwav__chunk_padding_size_w64(in_RDI[0x10]);
      }
      if (local_18 != 0) {
        drwav__write(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x162c25);
      }
      if ((in_RDI[2] != 0) && ((int)in_RDI[0x14] == 0)) {
        if ((int)in_RDI[8] == 0) {
          iVar1 = (*(code *)in_RDI[2])(in_RDI[3],4,0);
          if (iVar1 != 0) {
            drwav__riff_chunk_size_riff((drwav_uint64)in_stack_ffffffffffffffb0);
            drwav__write_u32ne_to_le(in_stack_ffffffffffffffa8,0);
          }
          iVar1 = (*(code *)in_RDI[2])(in_RDI[3],(int)in_RDI[0x11] + 4,0);
          if (iVar1 != 0) {
            drwav__data_chunk_size_riff(in_RDI[0x10]);
            drwav__write_u32ne_to_le(in_stack_ffffffffffffffa8,0);
          }
        }
        else if ((int)in_RDI[8] == 1) {
          iVar1 = (*(code *)in_RDI[2])(in_RDI[3],0x10,0);
          if (iVar1 != 0) {
            drwav__riff_chunk_size_w64((drwav_uint64)in_stack_ffffffffffffffb0);
            drwav__write_u64ne_to_le(in_stack_ffffffffffffffa8,0x162d41);
          }
          iVar1 = (*(code *)in_RDI[2])(in_RDI[3],(int)in_RDI[0x11] + 0x10,0);
          if (iVar1 != 0) {
            drwav__data_chunk_size_w64(in_RDI[0x10]);
            drwav__write_u64ne_to_le(in_stack_ffffffffffffffa8,0x162d92);
          }
        }
        else if ((int)in_RDI[8] == 2) {
          iVar1 = (*(code *)in_RDI[2])(in_RDI[3],0x14,0);
          if (iVar1 != 0) {
            drwav__riff_chunk_size_rf64((drwav_uint64)in_stack_ffffffffffffffb0);
            drwav__write_u64ne_to_le(in_stack_ffffffffffffffa8,0x162df5);
          }
          iVar1 = (*(code *)in_RDI[2])(in_RDI[3],0x1c,0);
          if (iVar1 != 0) {
            drwav__data_chunk_size_rf64(in_RDI[0x10]);
            drwav__write_u64ne_to_le(in_stack_ffffffffffffffa8,0x162e3c);
          }
        }
      }
      if (((int)in_RDI[0x14] != 0) && (in_RDI[0x10] != in_RDI[0x13])) {
        local_14 = -10;
      }
    }
    if (((code *)*in_RDI == drwav__on_read_stdio) || ((code *)in_RDI[1] == drwav__on_write_stdio)) {
      fclose((FILE *)in_RDI[3]);
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

DRWAV_API drwav_result drwav_uninit(drwav* pWav)
{
    drwav_result result = DRWAV_SUCCESS;

    if (pWav == NULL) {
        return DRWAV_INVALID_ARGS;
    }

    /*
    If the drwav object was opened in write mode we'll need to finalize a few things:
      - Make sure the "data" chunk is aligned to 16-bits for RIFF containers, or 64 bits for W64 containers.
      - Set the size of the "data" chunk.
    */
    if (pWav->onWrite != NULL) {
        drwav_uint32 paddingSize = 0;

        /* Padding. Do not adjust pWav->dataChunkDataSize - this should not include the padding. */
        if (pWav->container == drwav_container_riff || pWav->container == drwav_container_rf64) {
            paddingSize = drwav__chunk_padding_size_riff(pWav->dataChunkDataSize);
        } else {
            paddingSize = drwav__chunk_padding_size_w64(pWav->dataChunkDataSize);
        }
        
        if (paddingSize > 0) {
            drwav_uint64 paddingData = 0;
            drwav__write(pWav, &paddingData, paddingSize);  /* Byte order does not matter for this. */
        }

        /*
        Chunk sizes. When using sequential mode, these will have been filled in at initialization time. We only need
        to do this when using non-sequential mode.
        */
        if (pWav->onSeek && !pWav->isSequentialWrite) {
            if (pWav->container == drwav_container_riff) {
                /* The "RIFF" chunk size. */
                if (pWav->onSeek(pWav->pUserData, 4, drwav_seek_origin_start)) {
                    drwav_uint32 riffChunkSize = drwav__riff_chunk_size_riff(pWav->dataChunkDataSize);
                    drwav__write_u32ne_to_le(pWav, riffChunkSize);
                }

                /* the "data" chunk size. */
                if (pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos + 4, drwav_seek_origin_start)) {
                    drwav_uint32 dataChunkSize = drwav__data_chunk_size_riff(pWav->dataChunkDataSize);
                    drwav__write_u32ne_to_le(pWav, dataChunkSize);
                }
            } else if (pWav->container == drwav_container_w64) {
                /* The "RIFF" chunk size. */
                if (pWav->onSeek(pWav->pUserData, 16, drwav_seek_origin_start)) {
                    drwav_uint64 riffChunkSize = drwav__riff_chunk_size_w64(pWav->dataChunkDataSize);
                    drwav__write_u64ne_to_le(pWav, riffChunkSize);
                }

                /* The "data" chunk size. */
                if (pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos + 16, drwav_seek_origin_start)) {
                    drwav_uint64 dataChunkSize = drwav__data_chunk_size_w64(pWav->dataChunkDataSize);
                    drwav__write_u64ne_to_le(pWav, dataChunkSize);
                }
            } else if (pWav->container == drwav_container_rf64) {
                /* We only need to update the ds64 chunk. The "RIFF" and "data" chunks always have their sizes set to 0xFFFFFFFF for RF64. */
                int ds64BodyPos = 12 + 8;

                /* The "RIFF" chunk size. */
                if (pWav->onSeek(pWav->pUserData, ds64BodyPos + 0, drwav_seek_origin_start)) {
                    drwav_uint64 riffChunkSize = drwav__riff_chunk_size_rf64(pWav->dataChunkDataSize);
                    drwav__write_u64ne_to_le(pWav, riffChunkSize);
                }

                /* The "data" chunk size. */
                if (pWav->onSeek(pWav->pUserData, ds64BodyPos + 8, drwav_seek_origin_start)) {
                    drwav_uint64 dataChunkSize = drwav__data_chunk_size_rf64(pWav->dataChunkDataSize);
                    drwav__write_u64ne_to_le(pWav, dataChunkSize);
                }
            }
        }

        /* Validation for sequential mode. */
        if (pWav->isSequentialWrite) {
            if (pWav->dataChunkDataSize != pWav->dataChunkDataSizeTargetWrite) {
                result = DRWAV_INVALID_FILE;
            }
        }
    }

#ifndef DR_WAV_NO_STDIO
    /*
    If we opened the file with drwav_open_file() we will want to close the file handle. We can know whether or not drwav_open_file()
    was used by looking at the onRead and onSeek callbacks.
    */
    if (pWav->onRead == drwav__on_read_stdio || pWav->onWrite == drwav__on_write_stdio) {
        fclose((FILE*)pWav->pUserData);
    }
#endif

    return result;
}